

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

void __thiscall
Wasm::WasmBytecodeGenerator::YieldToBlock
          (WasmBytecodeGenerator *this,BlockInfo *blockInfo,PolymorphicEmitInfo polyExpr)

{
  IWasmByteCodeWriter *pIVar1;
  bool bVar2;
  OpCodeAsmJs OVar3;
  uint32 uVar4;
  WasmCompilationException *this_00;
  EmitInfo EVar5;
  EmitInfo EVar6;
  PolymorphicEmitInfo other;
  EmitInfo yieldInfo;
  EmitInfo expr;
  uint32 i;
  EmitInfo local_38;
  PolymorphicEmitInfo polyYieldInfo;
  BlockInfo *blockInfo_local;
  WasmBytecodeGenerator *this_local;
  PolymorphicEmitInfo polyExpr_local;
  
  polyExpr_local._0_8_ = polyExpr.field_1;
  this_local._0_4_ = polyExpr.count;
  polyYieldInfo.field_1 = (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)blockInfo;
  bVar2 = BlockInfo::HasYield(blockInfo);
  if ((bVar2) &&
     (bVar2 = PolymorphicEmitInfo::IsUnreachable((PolymorphicEmitInfo *)&this_local), !bVar2)) {
    local_38 = polyYieldInfo.field_1.infos[2];
    polyYieldInfo._0_8_ = polyYieldInfo.field_1.infos[3];
    other._4_4_ = 0;
    other.count = (uint32)this_local;
    other.field_1 = (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)polyExpr_local._0_8_;
    bVar2 = PolymorphicEmitInfo::IsEquivalent((PolymorphicEmitInfo *)&local_38,other);
    if (!bVar2) {
      this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException(this_00,L"Invalid yield type");
      __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                  WasmCompilationException::~WasmCompilationException);
    }
    bVar2 = IsUnreachable(this);
    if (!bVar2) {
      *(undefined1 *)&polyYieldInfo.field_1.infos[4].super_EmitInfoBase.location = 1;
      for (expr.super_EmitInfoBase.location = 0;
          uVar4 = PolymorphicEmitInfo::Count((PolymorphicEmitInfo *)&this_local),
          expr.super_EmitInfoBase.location < uVar4;
          expr.super_EmitInfoBase.location = expr.super_EmitInfoBase.location + 1) {
        EVar5 = PolymorphicEmitInfo::GetInfo
                          ((PolymorphicEmitInfo *)&this_local,expr.super_EmitInfoBase.location);
        EVar6 = PolymorphicEmitInfo::GetInfo
                          ((PolymorphicEmitInfo *)&local_38,expr.super_EmitInfoBase.location);
        pIVar1 = this->m_writer;
        yieldInfo.type = EVar5.type;
        OVar3 = GetReturnOp(this,yieldInfo.type);
        (*pIVar1->_vptr_IWasmByteCodeWriter[0xf])
                  (pIVar1,(ulong)OVar3,(ulong)EVar6 & 0xffffffff,(ulong)EVar5 & 0xffffffff);
      }
    }
  }
  return;
}

Assistant:

void WasmBytecodeGenerator::YieldToBlock(BlockInfo* blockInfo, PolymorphicEmitInfo polyExpr)
{
    if (blockInfo->HasYield() && !polyExpr.IsUnreachable())
    {
        PolymorphicEmitInfo polyYieldInfo = blockInfo->yieldInfo;

        if (!polyYieldInfo.IsEquivalent(polyExpr))
        {
            throw WasmCompilationException(_u("Invalid yield type"));
        }

        if (!IsUnreachable())
        {
            blockInfo->didYield = true;
            for (uint32 i = 0; i < polyExpr.Count(); ++i)
            {
                EmitInfo expr = polyExpr.GetInfo(i);
                EmitInfo yieldInfo = polyYieldInfo.GetInfo(i);
                m_writer->AsmReg2(GetReturnOp(expr.type), yieldInfo.location, expr.location);
            }
        }
    }
}